

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

void flatbuffers::PrintVector<int>
               (Vector<int> *v,Type type,int indent,int indent_step,string *_text)

{
  int indent_00;
  ulong uVar1;
  
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::append((char *)_text);
  if (*(int *)v != 0) {
    indent_00 = indent_step + indent;
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__cxx11::string::append((char *)_text);
        std::__cxx11::string::append((char *)_text);
      }
      std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent_00);
      if ((type.base_type == BASE_TYPE_STRUCT) && ((type.struct_def)->fixed == true)) {
        Print<void_const*>(v + (type.struct_def)->bytesize * uVar1 + 4,type,indent_00,indent_step,
                           (StructDef *)0x0,_text);
      }
      else {
        if (*(uint *)v <= uVar1) {
          __assert_fail("i < Length()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                        ,0xa7,"return_type flatbuffers::Vector<int>::Get(uoffset_t) const [T = int]"
                       );
        }
        Print<int>(*(int *)(v + uVar1 * 4 + 4),type,indent_00,indent_step,(StructDef *)0x0,_text);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < *(uint *)v);
  }
  std::__cxx11::string::append((char *)_text);
  std::__cxx11::string::_M_replace_aux((ulong)_text,_text->_M_string_length,0,(char)indent);
  std::__cxx11::string::append((char *)_text);
  return;
}

Assistant:

void PrintVector(const Vector<T> &v, Type type,
                                      int indent, int indent_step,
                                      std::string *_text) {
  std::string &text = *_text;
  text += "[";
  text += NewLine(indent_step);
  for (uoffset_t i = 0; i < v.Length(); i++) {
    if (i) {
      text += ",";
      text += NewLine(indent_step);
    }
    text.append(indent + indent_step, ' ');
    if (IsStruct(type))
      Print(v.GetStructFromOffset(i * type.struct_def->bytesize), type,
            indent + indent_step, indent_step, nullptr, _text);
    else
      Print(v.Get(i), type, indent + indent_step, indent_step, nullptr, _text);
  }
  text += NewLine(indent_step);
  text.append(indent, ' ');
  text += "]";
}